

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O3

Status __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::GenerateFromSchema
          (LuaBfbsGenerator *this,Schema *schema,CodeGenOptions *options)

{
  ulong uVar1;
  code *pcVar2;
  long lVar3;
  unsigned_short vtsize;
  Schema *pSVar4;
  Schema *pSVar5;
  LuaBfbsGenerator *local_68;
  Schema **local_60;
  code *local_58;
  code *local_50;
  Schema *local_48;
  LuaBfbsGenerator *local_40;
  Schema *local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->options_);
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 7) ||
     (uVar1 = (ulong)*(ushort *)(schema + (6 - (long)*(int *)schema)), uVar1 == 0)) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    pSVar5 = schema + *(uint *)(schema + uVar1) + uVar1;
  }
  local_60 = (Schema **)0x0;
  local_50 = std::
             _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:142:24)>
             ::_M_invoke;
  pcVar2 = std::
           _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:142:24)>
           ::_M_manager;
  local_58 = std::
             _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:142:24)>
             ::_M_manager;
  local_68 = this;
  if ((*(uint *)pSVar5 & 0x3fffffff) == 0) {
LAB_0031daa2:
    (*pcVar2)(&local_68,&local_68,3);
  }
  else {
    local_48 = pSVar5 + (ulong)*(uint *)(pSVar5 + 4) + 4;
    pSVar4 = pSVar5 + 8;
    local_40 = this;
    do {
      (*local_50)(&local_68,&local_48);
      pcVar2 = local_58;
      if (pSVar4 == pSVar5 + (ulong)(*(uint *)pSVar5 << 2) + 4) goto LAB_0031da98;
      local_48 = pSVar4 + *(uint *)pSVar4;
      pSVar4 = pSVar4 + 4;
    } while (local_58 != (code *)0x0);
    pcVar2 = (code *)std::__throw_bad_function_call();
LAB_0031da98:
    this = local_40;
    if (pcVar2 != (code *)0x0) goto LAB_0031daa2;
  }
  if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
    pSVar5 = (Schema *)0x0;
  }
  else {
    lVar3 = -(long)*(int *)schema;
    uVar1 = (ulong)*(ushort *)(schema + lVar3 + 4);
    if (uVar1 == 0) {
      pSVar5 = (Schema *)0x0;
    }
    else {
      pSVar5 = schema + *(uint *)(schema + uVar1) + uVar1;
    }
    if ((0xc < *(ushort *)(schema + -(long)*(int *)schema)) &&
       (uVar1 = (ulong)*(ushort *)(schema + lVar3 + 0xc), uVar1 != 0)) {
      local_38 = schema + *(uint *)(schema + uVar1) + uVar1;
      goto LAB_0031db04;
    }
  }
  local_38 = (Schema *)0x0;
LAB_0031db04:
  local_60 = &local_38;
  local_50 = std::
             _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:170:28)>
             ::_M_invoke;
  pcVar2 = std::
           _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:170:28)>
           ::_M_manager;
  local_58 = std::
             _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_lua.cpp:170:28)>
             ::_M_manager;
  local_68 = this;
  if ((*(uint *)pSVar5 & 0x3fffffff) != 0) {
    local_48 = pSVar5 + (ulong)*(uint *)(pSVar5 + 4) + 4;
    pSVar4 = pSVar5 + 8;
    do {
      (*local_50)(&local_68,&local_48);
      pcVar2 = local_58;
      if (pSVar4 == pSVar5 + (ulong)(*(uint *)pSVar5 << 2) + 4) goto LAB_0031db87;
      local_48 = pSVar4 + *(uint *)pSVar4;
      pSVar4 = pSVar4 + 4;
    } while (local_58 != (code *)0x0);
    pcVar2 = (code *)std::__throw_bad_function_call();
LAB_0031db87:
    if (pcVar2 == (code *)0x0) {
      return OK;
    }
  }
  (*pcVar2)(&local_68,&local_68,3);
  return OK;
}

Assistant:

Status GenerateFromSchema(const r::Schema *schema,
                            const CodeGenOptions &options)
      FLATBUFFERS_OVERRIDE {
    options_ = options;
    if (!GenerateEnums(schema->enums())) { return ERROR; }
    if (!GenerateObjects(schema->objects(), schema->root_table())) {
      return ERROR;
    }
    return OK;
  }